

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.hpp
# Opt level: O2

void __thiscall
boost::xpressive::detail::
dynamic_xpression<boost::xpressive::detail::lookbehind_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::repeat_(undefined8 param_1,undefined8 param_2,long seq)

{
  source_location local_60;
  regex_error local_48;
  
  if (*(int *)(seq + 0x10) != 0) {
    repeat_();
    return;
  }
  regex_error::regex_error(&local_48,error_badrepeat,"expression cannot be quantified");
  local_60.file_ =
       "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/detail/dynamic/dynamic.hpp"
  ;
  local_60.function_ =
       "void boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::lookbehind_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>>, __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::repeat_(const quant_spec &, sequence<BidiIter> &, mpl::int_<quant_none>, mpl::false_) const [Matcher = boost::xpressive::detail::lookbehind_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>>, BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>]"
  ;
  local_60.line_ = 0x76;
  local_60.column_ = 0;
  throw_exception<boost::xpressive::regex_error>(&local_48,&local_60);
}

Assistant:

void repeat_(quant_spec const &spec, sequence<BidiIter> &seq, mpl::int_<quant_none>, mpl::false_) const
    {
        if(quant_none == seq.quant())
        {
            BOOST_THROW_EXCEPTION(
                regex_error(regex_constants::error_badrepeat, "expression cannot be quantified")
            );
        }
        else
        {
            this->repeat_(spec, seq, mpl::int_<quant_variable_width>(), mpl::false_());
        }
    }